

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O1

void __thiscall
soul::heart::BranchIf::BranchIf(BranchIf *this,Expression *cond,Block *trueJump,Block *falseJump)

{
  uint64_t *puVar1;
  long lVar2;
  
  (this->super_Terminator).super_Object.location.sourceCode.object = (SourceCodeText *)0x0;
  (this->super_Terminator).super_Object.location.location.data = (char *)0x0;
  (this->super_Terminator).super_Object._vptr_Object = (_func_int **)&PTR__BranchIf_00307480;
  (this->condition).object = cond;
  this->targets[0].object = trueJump;
  this->targets[1].object = falseJump;
  puVar1 = this->targetArgs[0].space;
  lVar2 = 0x70;
  do {
    ((ArgListType *)(puVar1 + -3))->items = (pool_ref<soul::heart::Expression> *)puVar1;
    puVar1[-2] = 0;
    puVar1[-1] = 4;
    puVar1 = puVar1 + 7;
    lVar2 = lVar2 + -0x38;
  } while (lVar2 != 0);
  if (this->targets[1].object != trueJump) {
    return;
  }
  throwInternalCompilerError("targets[0] != targets[1]","BranchIf",0x452);
}

Assistant:

BranchIf (Expression& cond, Block& trueJump, Block& falseJump)
            : condition (cond), targets { trueJump, falseJump }
        {
            SOUL_ASSERT (targets[0] != targets[1]);
        }